

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O3

void deBsdAddressToSocketAddress(deSocketAddress *address,sockaddr *bsdAddr,int addrLen)

{
  socklen_t __len;
  char *__cp;
  int __af;
  char buf [16];
  char acStack_38 [40];
  
  if (bsdAddr->sa_family == 10) {
    address->family = DE_SOCKETFAMILY_INET6;
    address->port =
         (uint)(ushort)(*(ushort *)bsdAddr->sa_data << 8 | *(ushort *)bsdAddr->sa_data >> 8);
    __cp = bsdAddr->sa_data + 6;
    __af = 10;
    __len = 0x28;
  }
  else {
    if (bsdAddr->sa_family != 2) {
      return;
    }
    address->family = DE_SOCKETFAMILY_INET4;
    address->port =
         (uint)(ushort)(*(ushort *)bsdAddr->sa_data << 8 | *(ushort *)bsdAddr->sa_data >> 8);
    __cp = bsdAddr->sa_data + 2;
    __af = 2;
    __len = 0x10;
  }
  inet_ntop(__af,__cp,acStack_38,__len);
  deSocketAddress_setHost(address,acStack_38);
  return;
}

Assistant:

void deBsdAddressToSocketAddress (deSocketAddress* address, const struct sockaddr* bsdAddr, int addrLen)
{
	/* Decode client address info. */
	if (bsdAddr->sa_family == AF_INET)
	{
		const struct sockaddr_in* addr4 = (const struct sockaddr_in*)bsdAddr;
		DE_ASSERT(addrLen >= (int)sizeof(struct sockaddr_in));
		DE_UNREF(addrLen);

		deSocketAddress_setFamily(address, DE_SOCKETFAMILY_INET4);
		deSocketAddress_setPort(address, (int)deNetworkToHostOrder16((deUint16)addr4->sin_port));

		{
			char buf[16]; /* Max valid address takes 3*4 + 3 = 15 chars */
			inet_ntop(AF_INET, (void*)&addr4->sin_addr, buf, sizeof(buf));
			deSocketAddress_setHost(address, buf);
		}
	}
	else if (bsdAddr->sa_family == AF_INET6)
	{
		const struct sockaddr_in6* addr6 = (const struct sockaddr_in6*)bsdAddr;
		DE_ASSERT(addrLen >= (int)sizeof(struct sockaddr_in6));
		DE_UNREF(addrLen);

		deSocketAddress_setFamily(address, DE_SOCKETFAMILY_INET6);
		deSocketAddress_setPort(address, (int)deNetworkToHostOrder16((deUint16)addr6->sin6_port));

		{
			char buf[40]; /* Max valid address takes 8*4 + 7 = 39 chars */
			inet_ntop(AF_INET6, (void*)&addr6->sin6_addr, buf, sizeof(buf));
			deSocketAddress_setHost(address, buf);
		}
	}
	else
		DE_ASSERT(DE_FALSE);
}